

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::TestCase::Run(TestCase *this)

{
  TestEventRepeater *pTVar1;
  UnitTestImpl *this_00;
  __time_t _Var2;
  OsStackTraceGetterInterface *pOVar3;
  pointer ppTVar4;
  long lVar5;
  long lVar6;
  timeval now;
  timeval local_40;
  
  if (this->should_run_ == true) {
    UnitTest::GetInstance();
    this_00 = UnitTest::GetInstance::instance.impl_;
    (UnitTest::GetInstance::instance.impl_)->current_test_case_ = this;
    UnitTest::GetInstance();
    pTVar1 = ((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_;
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[6])(pTVar1,this);
    pOVar3 = internal::UnitTestImpl::os_stack_trace_getter(this_00);
    (*pOVar3->_vptr_OsStackTraceGetterInterface[3])(pOVar3);
    internal::HandleExceptionsInMethodIfSupported<testing::TestCase,void>(this,0x137c9e,(char *)0x0)
    ;
    gettimeofday(&local_40,(__timezone_ptr_t)0x0);
    _Var2 = local_40.tv_sec;
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_usec),8);
    ppTVar4 = (this->test_info_list_).
              super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->test_info_list_).
                                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar4) >> 3)) {
      lVar6 = 0;
      do {
        TestInfo::Run(ppTVar4[(uint)(this->test_indices_).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[lVar6]]);
        lVar6 = lVar6 + 1;
        ppTVar4 = (this->test_info_list_).
                  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (lVar6 < (int)((ulong)((long)(this->test_info_list_).
                                           super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppTVar4) >> 3));
    }
    gettimeofday(&local_40,(__timezone_ptr_t)0x0);
    this->elapsed_time_ =
         (local_40.tv_sec - _Var2) * 1000 +
         local_40.tv_usec / 1000 + ((lVar5 >> 7) - (lVar5 >> 0x3f));
    pOVar3 = internal::UnitTestImpl::os_stack_trace_getter(this_00);
    (*pOVar3->_vptr_OsStackTraceGetterInterface[3])(pOVar3);
    internal::HandleExceptionsInMethodIfSupported<testing::TestCase,void>(this,0x137ca2,(char *)0x0)
    ;
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[10])(pTVar1,this);
    this_00->current_test_case_ = (TestCase *)0x0;
  }
  return;
}

Assistant:

void TestCase::Run() {
  if (!should_run_) return;

  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_case(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  repeater->OnTestCaseStart(*this);
  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestCase::RunSetUpTestCase, "SetUpTestCase()");

  const internal::TimeInMillis start = internal::GetTimeInMillis();
  for (int i = 0; i < total_test_count(); i++) {
    GetMutableTestInfo(i)->Run();
  }
  elapsed_time_ = internal::GetTimeInMillis() - start;

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestCase::RunTearDownTestCase, "TearDownTestCase()");

  repeater->OnTestCaseEnd(*this);
  impl->set_current_test_case(NULL);
}